

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLproxycode
Curl_SOCKS4(char *proxy_user,char *hostname,int remote_port,int sockindex,Curl_easy *data,
           _Bool *done)

{
  long lVar1;
  _Bool *data_00;
  resolve_t rVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  size_t hostnamelen;
  size_t packetsize;
  size_t plen;
  char buf [64];
  sockaddr_in *saddr_in;
  Curl_addrinfo *hp;
  long lStack_78;
  resolve_t rc;
  ssize_t written;
  ssize_t actualread;
  Curl_dns_entry *dns;
  connstate *sx;
  curl_socket_t sockfd;
  CURLcode result;
  uchar *socksreq;
  connectdata *pcStack_40;
  _Bool protocol4a;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  int sockindex_local;
  int remote_port_local;
  char *hostname_local;
  char *proxy_user_local;
  
  dns = (Curl_dns_entry *)data->conn;
  socksreq._7_1_ = (((connectdata *)dns)->socks_proxy).proxytype == CURLPROXY_SOCKS4A;
  _sockfd = (data->state).buffer;
  sx._0_4_ = ((connectdata *)dns)->sock[sockindex];
  actualread = 0;
  pcStack_40 = (connectdata *)dns;
  conn = (connectdata *)done;
  done_local = (_Bool *)data;
  data_local._0_4_ = sockindex;
  data_local._4_4_ = remote_port;
  _sockindex_local = hostname;
  hostname_local = proxy_user;
  if ((((((connectdata *)dns)->cnnct).state == CONNECT_INIT) ||
      (CONNECT_REQ_READ_MORE < (((connectdata *)dns)->cnnct).state)) && ((*done & 1U) == 0)) {
    socksstate(data,CONNECT_SOCKS_INIT);
  }
  switch(*(undefined4 *)&dns->addr) {
  case 1:
    pcStack_40->ip_version = '\x01';
    if ((*(ulong *)&(pcStack_40->bits).field_0x4 & 1) != 0) {
      pcVar4 = "";
      if ((socksreq._7_1_ & 1) != 0) {
        pcVar4 = "a";
      }
      Curl_infof((Curl_easy *)done_local,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar4,
                 _sockindex_local,(ulong)data_local._4_4_);
    }
    Curl_infof((Curl_easy *)done_local,"SOCKS4 communication to %s:%d",_sockindex_local,
               (ulong)data_local._4_4_);
    *_sockfd = '\x04';
    _sockfd[1] = '\x01';
    _sockfd[2] = (char)(data_local._4_4_ >> 8);
    _sockfd[3] = (char)data_local._4_4_;
    if ((socksreq._7_1_ & 1) == 0) {
      rVar2 = Curl_resolv((Curl_easy *)done_local,_sockindex_local,data_local._4_4_,false,
                          (Curl_dns_entry **)&actualread);
      if (rVar2 == CURLRESOLV_ERROR) {
        return CURLPX_RESOLVE_HOST;
      }
      if (rVar2 == CURLRESOLV_PENDING) {
        socksstate((Curl_easy *)done_local,CONNECT_RESOLVING);
        Curl_infof((Curl_easy *)done_local,"SOCKS4 non-blocking resolve of %s",_sockindex_local);
        return CURLPX_OK;
      }
      socksstate((Curl_easy *)done_local,CONNECT_RESOLVED);
      goto switchD_001693ba_caseD_b;
    }
    socksstate((Curl_easy *)done_local,CONNECT_REQ_INIT);
    break;
  default:
    goto LAB_001699b5;
  case 4:
    goto switchD_001693ba_caseD_4;
  case 9:
    break;
  case 10:
    actualread = (ssize_t)Curl_fetch_addr((Curl_easy *)done_local,_sockindex_local,pcStack_40->port)
    ;
    if ((Curl_dns_entry *)actualread == (Curl_dns_entry *)0x0) {
      sx._4_4_ = Curl_resolv_check((Curl_easy *)done_local,(Curl_dns_entry **)&actualread);
      if (actualread == 0) {
        if (sx._4_4_ != CURLE_OK) {
          return CURLPX_RESOLVE_HOST;
        }
        return CURLPX_OK;
      }
    }
    else {
      *(ssize_t *)(done_local + 0xed0) = actualread;
      done_local[0xef0] = (_Bool)(done_local[0xef0] & 0xfeU | 1);
      Curl_infof((Curl_easy *)done_local,"Hostname \'%s\' was found",_sockindex_local);
      socksstate((Curl_easy *)done_local,CONNECT_RESOLVED);
    }
  case 0xb:
switchD_001693ba_caseD_b:
    saddr_in = (sockaddr_in *)0x0;
    if (actualread == 0) {
      Curl_failf((Curl_easy *)done_local,"Failed to resolve \"%s\" for SOCKS4 connect.",
                 _sockindex_local);
    }
    else {
      saddr_in = *(sockaddr_in **)actualread;
      while( true ) {
        bVar5 = false;
        if (saddr_in != (sockaddr_in *)0x0) {
          bVar5 = (saddr_in->sin_addr).s_addr != 2;
        }
        if (!bVar5) break;
        saddr_in = *(sockaddr_in **)saddr_in[2].sin_zero;
      }
      if (saddr_in == (sockaddr_in *)0x0) {
        Curl_failf((Curl_easy *)done_local,"SOCKS4 connection to %s not supported",_sockindex_local)
        ;
      }
      else {
        Curl_printable_address((Curl_addrinfo *)saddr_in,(char *)&plen,0x40);
        lVar1 = *(long *)(saddr_in + 2);
        _sockfd[4] = *(char *)(lVar1 + 4);
        _sockfd[5] = *(char *)(lVar1 + 5);
        _sockfd[6] = *(char *)(lVar1 + 6);
        _sockfd[7] = *(char *)(lVar1 + 7);
        Curl_infof((Curl_easy *)done_local,"SOCKS4 connect to IPv4 %s (locally resolved)",&plen);
        Curl_resolv_unlock((Curl_easy *)done_local,(Curl_dns_entry *)actualread);
      }
    }
    if (saddr_in == (sockaddr_in *)0x0) {
      return CURLPX_RESOLVE_HOST;
    }
    break;
  case 0xe:
    goto switchD_001693ba_caseD_e;
  }
  _sockfd[8] = '\0';
  if (hostname_local != (char *)0x0) {
    sVar3 = strlen(hostname_local);
    if (*(long *)(done_local + 0x750) - 8U <= sVar3) {
      Curl_failf((Curl_easy *)done_local,"Too long SOCKS proxy user name, can\'t use!");
      return CURLPX_LONG_USER;
    }
    memcpy(_sockfd + 8,hostname_local,sVar3 + 1);
  }
  sVar3 = strlen(_sockfd + 8);
  hostnamelen = sVar3 + 9;
  if ((socksreq._7_1_ & 1) != 0) {
    _sockfd[4] = '\0';
    _sockfd[5] = '\0';
    _sockfd[6] = '\0';
    _sockfd[7] = '\x01';
    sVar3 = strlen(_sockindex_local);
    if (0xff < sVar3 + 1) {
      Curl_failf((Curl_easy *)done_local,"SOCKS4: too long host name");
      return CURLPX_LONG_HOSTNAME;
    }
    strcpy(_sockfd + hostnamelen,_sockindex_local);
    hostnamelen = sVar3 + 1 + hostnamelen;
  }
  dns->inuse = (long)_sockfd;
  dns->timestamp = hostnamelen;
  socksstate((Curl_easy *)done_local,CONNECT_REQ_SENDING);
switchD_001693ba_caseD_e:
  sx._4_4_ = Curl_write_plain((Curl_easy *)done_local,(curl_socket_t)sx,(void *)dns->inuse,
                              dns->timestamp,&stack0xffffffffffffff88);
  if ((sx._4_4_ == CURLE_OK) || (sx._4_4_ == CURLE_AGAIN)) {
    if (lStack_78 == dns->timestamp) {
      dns->timestamp = 8;
      dns->inuse = (long)_sockfd;
      socksstate((Curl_easy *)done_local,CONNECT_SOCKS_READ);
switchD_001693ba_caseD_4:
      sx._4_4_ = Curl_read_plain((curl_socket_t)sx,(char *)dns->inuse,dns->timestamp,&written);
      data_00 = done_local;
      if ((sx._4_4_ == CURLE_OK) || (sx._4_4_ == CURLE_AGAIN)) {
        if ((sx._4_4_ == CURLE_OK) && (written == 0)) {
          Curl_failf((Curl_easy *)done_local,"connection to proxy closed");
          proxy_user_local._4_4_ = CURLPX_CLOSED;
        }
        else if (written == dns->timestamp) {
          socksstate((Curl_easy *)done_local,CONNECT_DONE);
LAB_001699b5:
          if (*_sockfd == '\0') {
            switch(_sockfd[1]) {
            case 'Z':
              pcVar4 = "";
              if ((socksreq._7_1_ & 1) != 0) {
                pcVar4 = "a";
              }
              Curl_infof((Curl_easy *)done_local,"SOCKS4%s request granted.",pcVar4);
              *(undefined1 *)&(conn->cnnct).state = CONNECT_SOCKS_INIT;
              proxy_user_local._4_4_ = CURLPX_OK;
              break;
            case '[':
              Curl_failf((Curl_easy *)done_local,
                         "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                         ,(ulong)(byte)_sockfd[4],(ulong)(byte)_sockfd[5],(ulong)(byte)_sockfd[6],
                         (ulong)(byte)_sockfd[7],(uint)CONCAT11(_sockfd[2],_sockfd[3]),
                         (uint)(byte)_sockfd[1]);
              proxy_user_local._4_4_ = CURLPX_REQUEST_FAILED;
              break;
            case '\\':
              Curl_failf((Curl_easy *)done_local,
                         "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                         ,(ulong)(byte)_sockfd[4],(ulong)(byte)_sockfd[5],(ulong)(byte)_sockfd[6],
                         (ulong)(byte)_sockfd[7],(uint)CONCAT11(_sockfd[2],_sockfd[3]),
                         (uint)(byte)_sockfd[1]);
              proxy_user_local._4_4_ = CURLPX_IDENTD;
              break;
            case ']':
              Curl_failf((Curl_easy *)done_local,
                         "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                         ,(ulong)(byte)_sockfd[4],(ulong)(byte)_sockfd[5],(ulong)(byte)_sockfd[6],
                         (ulong)(byte)_sockfd[7],(uint)CONCAT11(_sockfd[2],_sockfd[3]),
                         (uint)(byte)_sockfd[1]);
              proxy_user_local._4_4_ = CURLPX_IDENTD_DIFFER;
              break;
            default:
              Curl_failf((Curl_easy *)done_local,
                         "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                         (ulong)(byte)_sockfd[4],(ulong)(byte)_sockfd[5],(ulong)(byte)_sockfd[6],
                         (ulong)(byte)_sockfd[7],(uint)CONCAT11(_sockfd[2],_sockfd[3]),
                         (uint)(byte)_sockfd[1]);
              proxy_user_local._4_4_ = CURLPX_UNKNOWN_FAIL;
            }
          }
          else {
            Curl_failf((Curl_easy *)done_local,
                       "SOCKS4 reply has wrong version, version should be 0.");
            proxy_user_local._4_4_ = CURLPX_BAD_VERSION;
          }
        }
        else {
          dns->timestamp = dns->timestamp - written;
          dns->inuse = written + dns->inuse;
          proxy_user_local._4_4_ = CURLPX_OK;
        }
      }
      else {
        pcVar4 = curl_easy_strerror(sx._4_4_);
        Curl_failf((Curl_easy *)data_00,"SOCKS4: Failed receiving connect request ack: %s",pcVar4);
        proxy_user_local._4_4_ = CURLPX_RECV_CONNECT;
      }
    }
    else {
      dns->timestamp = dns->timestamp - lStack_78;
      dns->inuse = lStack_78 + dns->inuse;
      proxy_user_local._4_4_ = CURLPX_OK;
    }
  }
  else {
    Curl_failf((Curl_easy *)done_local,"Failed to send SOCKS4 connect request.");
    proxy_user_local._4_4_ = CURLPX_SEND_CONNECT;
  }
  return proxy_user_local._4_4_;
}

Assistant:

CURLproxycode Curl_SOCKS4(const char *proxy_user,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  struct connectdata *conn = data->conn;
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A) ? TRUE : FALSE;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;
  ssize_t actualread;
  ssize_t written;

  /* make sure that the buffer is at least 600 bytes */
  DEBUGASSERT(READBUFFER_MIN >= 600);

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    /* SOCKS4 can only do IPv4, insist! */
    conn->ip_version = CURL_IPRESOLVE_V4;
    if(conn->bits.httpproxy)
      infof(data, "SOCKS4%s: connecting to HTTP proxy %s port %d",
            protocol4a ? "a" : "", hostname, remote_port);

    infof(data, "SOCKS4 communication to %s:%d", hostname, remote_port);

    /*
     * Compose socks4 request
     *
     * Request format
     *
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     * # of bytes:  1    1      2              4           variable       1
     */

    socksreq[0] = 4; /* version (SOCKS4) */
    socksreq[1] = 1; /* connect */
    socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
    socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

    /* DNS resolve only for SOCKS4, not SOCKS4a */
    if(!protocol4a) {
      enum resolve_t rc =
        Curl_resolv(data, hostname, remote_port, FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;
      else if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        infof(data, "SOCKS4 non-blocking resolve of %s", hostname);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }

    /* socks4a doesn't resolve anything locally */
    sxstate(data, CONNECT_REQ_INIT);
    goto CONNECT_REQ_INIT;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, (int)conn->port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "Hostname '%s' was found", hostname);
      sxstate(data, CONNECT_RESOLVED);
    }
    else {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns) {
      hp = dns->addr;

      /* scan for the first IPv4 address */
      while(hp && (hp->ai_family != AF_INET))
        hp = hp->ai_next;

      if(hp) {
        struct sockaddr_in *saddr_in;
        char buf[64];
        Curl_printable_address(hp, buf, sizeof(buf));

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)", buf);

        Curl_resolv_unlock(data, dns); /* not used anymore from now on */
      }
      else
        failf(data, "SOCKS4 connection to %s not supported", hostname);
    }
    else
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);

    if(!hp)
      return CURLPX_RESOLVE_HOST;
  }
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    /*
     * This is currently not supporting "Identification Protocol (RFC1413)".
     */
    socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
    if(proxy_user) {
      size_t plen = strlen(proxy_user);
      if(plen >= (size_t)data->set.buffer_size - 8) {
        failf(data, "Too long SOCKS proxy user name, can't use!");
        return CURLPX_LONG_USER;
      }
      /* copy the proxy name WITH trailing zero */
      memcpy(socksreq + 8, proxy_user, plen + 1);
    }

    /*
     * Make connection
     */
    {
      size_t packetsize = 9 +
        strlen((char *)socksreq + 8); /* size including NUL */

      /* If SOCKS4a, set special invalid IP address 0.0.0.x */
      if(protocol4a) {
        size_t hostnamelen = 0;
        socksreq[4] = 0;
        socksreq[5] = 0;
        socksreq[6] = 0;
        socksreq[7] = 1;
        /* append hostname */
        hostnamelen = strlen(hostname) + 1; /* length including NUL */
        if(hostnamelen <= 255)
          strcpy((char *)socksreq + packetsize, hostname);
        else {
          failf(data, "SOCKS4: too long host name");
          return CURLPX_LONG_HOSTNAME;
        }
        packetsize += hostnamelen;
      }
      sx->outp = socksreq;
      sx->outstanding = packetsize;
      sxstate(data, CONNECT_REQ_SENDING);
    }
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    /* Send request */
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }

    /* done sending! */
    sx->outstanding = 8; /* receive data size */
    sx->outp = socksreq;
    sxstate(data, CONNECT_SOCKS_READ);

    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    /* Receive response */
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "SOCKS4: Failed receiving connect request ack: %s",
            curl_easy_strerror(result));
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
    break;
  default: /* lots of unused states in SOCKS4 */
    break;
  }

  /*
   * Response format
   *
   *     +----+----+----+----+----+----+----+----+
   *     | VN | CD | DSTPORT |      DSTIP        |
   *     +----+----+----+----+----+----+----+----+
   * # of bytes:  1    1      2              4
   *
   * VN is the version of the reply code and should be 0. CD is the result
   * code with one of the following values:
   *
   * 90: request granted
   * 91: request rejected or failed
   * 92: request rejected because SOCKS server cannot connect to
   *     identd on the client
   * 93: request rejected because the client program and identd
   *     report different user-ids
   */

  /* wrong version ? */
  if(socksreq[0]) {
    failf(data,
          "SOCKS4 reply has wrong version, version should be 0.");
    return CURLPX_BAD_VERSION;
  }

  /* Result */
  switch(socksreq[1]) {
  case 90:
    infof(data, "SOCKS4%s request granted.", protocol4a?"a":"");
    break;
  case 91:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected or failed.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_REQUEST_FAILED;
  case 92:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because SOCKS server cannot connect to "
          "identd on the client.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD;
  case 93:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because the client program and identd "
          "report different user-ids.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD_DIFFER;
  default:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", Unknown.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_UNKNOWN_FAIL;
  }

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}